

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_test.cc
# Opt level: O3

void __thiscall ECDSATest_BuiltinCurves_Test::TestBody(ECDSATest_BuiltinCurves_Test *this)

{
  void *pvVar1;
  uchar *sig;
  _Head_base<0UL,_ec_group_st_*,_false> _Var2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  EC_KEY *eckey_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ECDSA_SIG *pEVar5;
  char *message;
  _Head_base<0UL,_ec_key_st_*,_false> in_R9;
  _Head_base<0UL,_ec_key_st_*,_false> _Var6;
  long lVar7;
  internal iVar8;
  bool bVar9;
  bool bVar10;
  ScopedTrace gtest_trace_163;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  UniquePtr<EC_KEY> eckey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature2;
  UniquePtr<ECDSA_SIG> ecdsa_sig;
  UniquePtr<EC_GROUP> group;
  uint sig_len;
  UniquePtr<EC_KEY> wrong_eckey;
  uint8_t digest [20];
  uint8_t wrong_digest [20];
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  ScopedTrace local_f9;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  pointer local_c8;
  _Head_base<0UL,_ec_key_st_*,_false> local_c0;
  AssertHelper local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  pointer local_a0;
  Bytes local_98;
  _Head_base<0UL,_ec_group_st_*,_false> local_88;
  AssertHelper local_80;
  uint local_74;
  _Head_base<0UL,_ec_key_st_*,_false> local_70;
  uchar local_68 [32];
  uchar local_48 [24];
  
  iVar3 = RAND_bytes(local_68,0x14);
  local_d8[0] = (internal)(iVar3 != 0);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_d8,(AssertionResult *)"RAND_bytes(digest, 20)",
               "false","true",(char *)in_R9._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x92,(char *)local_f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
  }
  else {
    iVar3 = RAND_bytes(local_48,0x14);
    local_d8[0] = (internal)(iVar3 != 0);
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_d8[0]) {
      lVar7 = 0;
      do {
        testing::ScopedTrace::ScopedTrace
                  (&local_f9,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                   ,0xa3,*(char **)((long)&TestBody::kCurves[0].name + lVar7));
        local_88._M_head_impl = (ec_group_st *)0x0;
        iVar3 = *(int *)((long)&TestBody::kCurves[0].nid + lVar7);
        if (iVar3 == 0x2c5) {
          NewSecp160r1Group();
          _Var2._M_head_impl = local_88._M_head_impl;
          local_88._M_head_impl = (ec_group_st *)local_f8;
          local_f8 = (undefined1  [8])0x0;
          if (_Var2._M_head_impl != (ec_group_st *)0x0) {
            EC_GROUP_free((EC_GROUP *)_Var2._M_head_impl);
          }
          std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)local_f8);
        }
        else {
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)EC_GROUP_new_by_curve_name(iVar3);
          _Var2._M_head_impl = local_88._M_head_impl;
          bVar9 = local_88._M_head_impl != (ec_group_st *)0x0;
          local_88._M_head_impl = (ec_group_st *)paVar4;
          if (bVar9) {
            EC_GROUP_free((EC_GROUP *)_Var2._M_head_impl);
          }
        }
        local_d8[0] = (internal)
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_88._M_head_impl !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0);
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_head_impl ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          testing::Message::Message((Message *)local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d8,(AssertionResult *)0x5a54c5,"false",
                     "true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xab,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
          if (local_f8 != (undefined1  [8])&local_e8) {
            operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
          }
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d0,local_d0);
          }
          goto LAB_002f0ca5;
        }
        eckey_00 = (EC_KEY *)EC_GROUP_get0_order(local_88._M_head_impl);
        local_c0._M_head_impl = (ec_key_st *)EC_KEY_new();
        local_d8[0] = (internal)(local_c0._M_head_impl != (ec_key_st *)0x0);
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_c0._M_head_impl == (ec_key_st *)0x0) {
          testing::Message::Message((Message *)local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d8,(AssertionResult *)0x54d28c,"false",
                     "true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb0,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
LAB_002f0ad3:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
          if (local_f8 != (undefined1  [8])&local_e8) {
            operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
          }
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d0,local_d0);
          }
LAB_002f0c9b:
          std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_c0);
LAB_002f0ca5:
          std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&local_88);
          testing::ScopedTrace::~ScopedTrace(&local_f9);
          return;
        }
        iVar3 = EC_KEY_set_group((EC_KEY *)local_c0._M_head_impl,(EC_GROUP *)local_88._M_head_impl);
        local_d8[0] = (internal)(iVar3 != 0);
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d8,
                     (AssertionResult *)"EC_KEY_set_group(eckey.get(), group.get())","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb1,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
          goto LAB_002f0ad3;
        }
        iVar3 = EC_KEY_generate_key((EC_KEY *)local_c0._M_head_impl);
        local_d8[0] = (internal)(iVar3 != 0);
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d8,
                     (AssertionResult *)"EC_KEY_generate_key(eckey.get())","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb2,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
          goto LAB_002f0ad3;
        }
        local_70._M_head_impl = (ec_key_st *)EC_KEY_new();
        local_d8[0] = (internal)(local_70._M_head_impl != (ec_key_st *)0x0);
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_70._M_head_impl == (ec_key_st *)0x0) {
          testing::Message::Message((Message *)local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d8,(AssertionResult *)"wrong_eckey",
                     "false","true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb6,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
LAB_002f0c44:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
          if (local_f8 != (undefined1  [8])&local_e8) {
            operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
          }
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d0,local_d0);
          }
          std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_70);
          goto LAB_002f0c9b;
        }
        iVar3 = EC_KEY_set_group((EC_KEY *)local_70._M_head_impl,(EC_GROUP *)local_88._M_head_impl);
        local_d8[0] = (internal)(iVar3 != 0);
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d8,
                     (AssertionResult *)"EC_KEY_set_group(wrong_eckey.get(), group.get())","false",
                     "true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb7,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
          goto LAB_002f0c44;
        }
        iVar3 = EC_KEY_generate_key((EC_KEY *)local_70._M_head_impl);
        local_d8[0] = (internal)(iVar3 != 0);
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d8,
                     (AssertionResult *)"EC_KEY_generate_key(wrong_eckey.get())","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xb8,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
          goto LAB_002f0c44;
        }
        iVar3 = EC_KEY_check_key((EC_KEY *)local_c0._M_head_impl);
        local_d8[0] = (internal)(iVar3 != 0);
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_d8[0]) {
          testing::Message::Message((Message *)local_b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_d8,
                     (AssertionResult *)"EC_KEY_check_key(eckey.get())","false","true",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xbb,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
          if (local_f8 != (undefined1  [8])&local_e8) {
            operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
          }
          if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d0,local_d0);
          }
        }
        iVar3 = ECDSA_size((EC_KEY *)local_c0._M_head_impl);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,
                   CONCAT44(extraout_var,iVar3),(allocator_type *)local_f8);
        in_R9._M_head_impl = local_c0._M_head_impl;
        iVar3 = ECDSA_sign(0,local_68,0x14,(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]),&local_74,
                           (EC_KEY *)local_c0._M_head_impl);
        local_b0[0] = (internal)(iVar3 != 0);
        local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)local_110);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_b0,
                     (AssertionResult *)
                     "ECDSA_sign(0, digest, 20, signature.data(), &sig_len, eckey.get())","false",
                     "true",(char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                     ,0xc2,(char *)local_f8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_110)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
          if (local_f8 != (undefined1  [8])&local_e8) {
            operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
          }
          if (local_110 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_110 + 8))();
          }
          if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a8,local_a8);
          }
          bVar9 = true;
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,
                     (ulong)local_74);
          iVar3 = ECDSA_size((EC_KEY *)local_c0._M_head_impl);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                     CONCAT44(extraout_var_00,iVar3),(allocator_type *)local_f8);
          in_R9._M_head_impl = local_c0._M_head_impl;
          iVar3 = ECDSA_sign(0,local_68,0x14,(uchar *)CONCAT71(local_b0._1_7_,local_b0[0]),&local_74
                             ,(EC_KEY *)local_c0._M_head_impl);
          local_110[0] = (internal)(iVar3 != 0);
          local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar3 == 0) {
            testing::Message::Message((Message *)&local_98);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f8,(internal *)local_110,
                       (AssertionResult *)
                       "ECDSA_sign(0, digest, 20, signature2.data(), &sig_len, eckey.get())","false"
                       ,"true",(char *)in_R9._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      (&local_b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                       ,0xc9,(char *)local_f8);
            testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
            testing::internal::AssertHelper::~AssertHelper(&local_b8);
            if (local_f8 != (undefined1  [8])&local_e8) {
              operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
            }
            if ((ECDSA_SIG *)local_98.span_.data_ != (ECDSA_SIG *)0x0) {
              (**(code **)&(*(BIGNUM **)local_98.span_.data_)->top)();
            }
            if (local_108 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_108,local_108);
            }
            bVar9 = true;
          }
          else {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
                       (ulong)local_74);
            local_110 = (undefined1  [8])CONCAT71(local_d8._1_7_,local_d8[0]);
            local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)local_d0 - (long)local_110);
            local_98.span_.data_ = (uchar *)CONCAT71(local_b0._1_7_,local_b0[0]);
            local_98.span_.size_ = (long)local_a8 - (long)local_98.span_.data_;
            testing::internal::CmpHelperNE<Bytes,Bytes>
                      ((internal *)local_f8,"Bytes(signature)","Bytes(signature2)",
                       (Bytes *)local_110,&local_98);
            if (local_f8[0] == '\0') {
              testing::Message::Message((Message *)local_110);
              message = "";
              if (local_f0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                message = (local_f0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xcb,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_98,(Message *)local_110);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
              if (local_110 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_110 + 8))();
              }
            }
            if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_f0,local_f0);
            }
            _Var6._M_head_impl = local_c0._M_head_impl;
            iVar3 = ECDSA_verify(0,local_68,0x14,(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]),
                                 (int)local_d0 - (int)(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]),
                                 (EC_KEY *)local_c0._M_head_impl);
            iVar8 = (internal)(iVar3 != 0);
            local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_110[0] = iVar8;
            if (!(bool)iVar8) {
              testing::Message::Message((Message *)&local_98);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_f8,(internal *)local_110,
                         (AssertionResult *)
                         "ECDSA_verify(0, digest, 20, signature.data(), signature.size(), eckey.get())"
                         ,"false","true",(char *)_Var6._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xcf,(char *)local_f8);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
              testing::internal::AssertHelper::~AssertHelper(&local_b8);
              if (local_f8 != (undefined1  [8])&local_e8) {
                operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
              }
              if ((long *)local_98.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_98.span_.data_ + 8))();
              }
              if (local_108 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_108,local_108);
              }
            }
            _Var6._M_head_impl = local_70._M_head_impl;
            iVar3 = ECDSA_verify(0,local_68,0x14,(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]),
                                 (int)local_d0 - (int)(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]),
                                 (EC_KEY *)local_70._M_head_impl);
            local_110[0] = (internal)(iVar3 == 0);
            local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_110[0]) {
              testing::Message::Message((Message *)&local_98);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_f8,(internal *)local_110,
                         (AssertionResult *)
                         "ECDSA_verify(0, digest, 20, signature.data(), signature.size(), wrong_eckey.get())"
                         ,"true","false",(char *)_Var6._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xd3,(char *)local_f8);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
              testing::internal::AssertHelper::~AssertHelper(&local_b8);
              if (local_f8 != (undefined1  [8])&local_e8) {
                operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
              }
              if ((long *)local_98.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_98.span_.data_ + 8))();
              }
              if (local_108 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_108,local_108);
              }
            }
            ERR_clear_error();
            _Var6._M_head_impl = local_c0._M_head_impl;
            iVar3 = ECDSA_verify(0,local_48,0x14,(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]),
                                 (int)local_d0 - (int)(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]),
                                 (EC_KEY *)local_c0._M_head_impl);
            local_110[0] = (internal)(iVar3 == 0);
            local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_110[0]) {
              testing::Message::Message((Message *)&local_98);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_f8,(internal *)local_110,
                         (AssertionResult *)
                         "ECDSA_verify(0, wrong_digest, 20, signature.data(), signature.size(), eckey.get())"
                         ,"true","false",(char *)_Var6._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xd8,(char *)local_f8);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
              testing::internal::AssertHelper::~AssertHelper(&local_b8);
              if (local_f8 != (undefined1  [8])&local_e8) {
                operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
              }
              if ((long *)local_98.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_98.span_.data_ + 8))();
              }
              if (local_108 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_108,local_108);
              }
            }
            ERR_clear_error();
            in_R9._M_head_impl = local_c0._M_head_impl;
            iVar3 = ECDSA_verify(0,local_68,0x14,(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]),
                                 ~(uint)(uchar *)CONCAT71(local_d8._1_7_,local_d8[0]) +
                                 (int)local_d0,(EC_KEY *)local_c0._M_head_impl);
            local_110[0] = (internal)(iVar3 == 0);
            local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!(bool)local_110[0]) {
              testing::Message::Message((Message *)&local_98);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_f8,(internal *)local_110,
                         (AssertionResult *)
                         "ECDSA_verify(0, digest, 20, signature.data(), signature.size() - 1, eckey.get())"
                         ,"true","false",(char *)in_R9._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_b8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xdd,(char *)local_f8);
              testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_98);
              testing::internal::AssertHelper::~AssertHelper(&local_b8);
              if (local_f8 != (undefined1  [8])&local_e8) {
                operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
              }
              if ((long *)local_98.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_98.span_.data_ + 8))();
              }
              if (local_108 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_108,local_108);
              }
            }
            ERR_clear_error();
            local_98.span_.data_ =
                 (uchar *)ECDSA_SIG_from_bytes
                                    ((uint8_t *)CONCAT71(local_d8._1_7_,local_d8[0]),
                                     (long)local_d0 - (long)CONCAT71(local_d8._1_7_,local_d8[0]));
            local_110[0] = (internal)((ECDSA_SIG *)local_98.span_.data_ != (ECDSA_SIG *)0x0);
            local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((ECDSA_SIG *)local_98.span_.data_ == (ECDSA_SIG *)0x0) {
              testing::Message::Message((Message *)&local_b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_f8,(internal *)local_110,(AssertionResult *)"ecdsa_sig",
                         "false","true",(char *)in_R9._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        (&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                         ,0xe3,(char *)local_f8);
              testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
LAB_002f0724:
              testing::internal::AssertHelper::~AssertHelper(&local_80);
              if (local_f8 != (undefined1  [8])&local_e8) {
                operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
              }
              if (local_b8.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_b8.data_ + 8))();
              }
              if (local_108 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_108,local_108);
              }
              bVar9 = true;
            }
            else {
              TestTamperedSig(kEncodedAPI,local_68,(size_t)local_98.span_.data_,
                              (ECDSA_SIG *)local_c0._M_head_impl,eckey_00,
                              (BIGNUM *)in_R9._M_head_impl);
              pEVar5 = ECDSA_do_sign(local_68,0x14,(EC_KEY *)local_c0._M_head_impl);
              sig = local_98.span_.data_;
              bVar9 = (ECDSA_SIG *)local_98.span_.data_ != (ECDSA_SIG *)0x0;
              local_98.span_.data_ = (uchar *)pEVar5;
              if (bVar9) {
                ECDSA_SIG_free((ECDSA_SIG *)sig);
              }
              local_110[0] = (internal)((ECDSA_SIG *)local_98.span_.data_ != (ECDSA_SIG *)0x0);
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if ((ECDSA_SIG *)local_98.span_.data_ == (ECDSA_SIG *)0x0) {
                testing::Message::Message((Message *)&local_b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f8,(internal *)local_110,(AssertionResult *)"ecdsa_sig",
                           "false","true",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xea,(char *)local_f8);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
                goto LAB_002f0724;
              }
              iVar3 = ECDSA_do_verify(local_68,0x14,(ECDSA_SIG *)local_98.span_.data_,
                                      (EC_KEY *)local_c0._M_head_impl);
              iVar8 = (internal)(iVar3 != 0);
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_110[0] = iVar8;
              if (!(bool)iVar8) {
                testing::Message::Message((Message *)&local_b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f8,(internal *)local_110,
                           (AssertionResult *)
                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())","false",
                           "true",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xed,(char *)local_f8);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                if (local_f8 != (undefined1  [8])&local_e8) {
                  operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
                }
                if (local_b8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_b8.data_ + 8))();
                }
                if (local_108 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,local_108);
                }
              }
              iVar3 = ECDSA_do_verify(local_68,0x14,(ECDSA_SIG *)local_98.span_.data_,
                                      (EC_KEY *)local_70._M_head_impl);
              local_110[0] = (internal)(iVar3 == 0);
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_110[0]) {
                testing::Message::Message((Message *)&local_b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f8,(internal *)local_110,
                           (AssertionResult *)
                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), wrong_eckey.get())","true",
                           "false",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xf1,(char *)local_f8);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                if (local_f8 != (undefined1  [8])&local_e8) {
                  operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
                }
                if (local_b8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_b8.data_ + 8))();
                }
                if (local_108 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,local_108);
                }
              }
              ERR_clear_error();
              iVar3 = ECDSA_do_verify(local_48,0x14,(ECDSA_SIG *)local_98.span_.data_,
                                      (EC_KEY *)local_c0._M_head_impl);
              local_110[0] = (internal)(iVar3 == 0);
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_110[0]) {
                testing::Message::Message((Message *)&local_b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f8,(internal *)local_110,
                           (AssertionResult *)
                           "ECDSA_do_verify(wrong_digest, 20, ecdsa_sig.get(), eckey.get())","true",
                           "false",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xf6,(char *)local_f8);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                if (local_f8 != (undefined1  [8])&local_e8) {
                  operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
                }
                if (local_b8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_b8.data_ + 8))();
                }
                if (local_108 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,local_108);
                }
              }
              ERR_clear_error();
              TestTamperedSig(kRawAPI,local_68,(size_t)local_98.span_.data_,
                              (ECDSA_SIG *)local_c0._M_head_impl,eckey_00,
                              (BIGNUM *)in_R9._M_head_impl);
              BN_set_negative(*(BIGNUM **)local_98.span_.data_,1);
              iVar3 = ECDSA_do_verify(local_68,0x14,(ECDSA_SIG *)local_98.span_.data_,
                                      (EC_KEY *)local_c0._M_head_impl);
              local_110[0] = (internal)(iVar3 == 0);
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_110[0]) {
                testing::Message::Message((Message *)&local_b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f8,(internal *)local_110,
                           (AssertionResult *)
                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())","true",
                           "false",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0xfe,(char *)local_f8);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                if (local_f8 != (undefined1  [8])&local_e8) {
                  operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
                }
                if (local_b8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_b8.data_ + 8))();
                }
                if (local_108 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,local_108);
                }
              }
              BN_set_negative(*(BIGNUM **)local_98.span_.data_,0);
              BN_set_negative(*(BIGNUM **)((long)local_98.span_.data_ + 8),1);
              iVar3 = ECDSA_do_verify(local_68,0x14,(ECDSA_SIG *)local_98.span_.data_,
                                      (EC_KEY *)local_c0._M_head_impl);
              local_110[0] = (internal)(iVar3 == 0);
              local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar3 != 0) {
                testing::Message::Message((Message *)&local_b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f8,(internal *)local_110,
                           (AssertionResult *)
                           "ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get())","true",
                           "false",(char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
                           ,0x101,(char *)local_f8);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_80);
                if (local_f8 != (undefined1  [8])&local_e8) {
                  operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
                }
                if (local_b8.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_b8.data_ + 8))();
                }
                if (local_108 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_108,local_108);
                }
              }
              bVar9 = false;
              BN_set_negative(*(BIGNUM **)((long)local_98.span_.data_ + 8),0);
            }
            std::unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ecdsa_sig_st,_bssl::internal::Deleter> *)&local_98);
          }
          pvVar1 = (void *)CONCAT71(local_b0._1_7_,local_b0[0]);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,(long)local_a0 - (long)pvVar1);
          }
        }
        pvVar1 = (void *)CONCAT71(local_d8._1_7_,local_d8[0]);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,(long)local_c8 - (long)pvVar1);
        }
        std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_70);
        std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_c0);
        std::unique_ptr<ec_group_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ec_group_st,_bssl::internal::Deleter> *)&local_88);
        testing::ScopedTrace::~ScopedTrace(&local_f9);
        bVar10 = lVar7 == 0x40;
        lVar7 = lVar7 + 0x10;
        if (bVar9 || bVar10) {
          return;
        }
      } while( true );
    }
    testing::Message::Message((Message *)local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_d8,
               (AssertionResult *)"RAND_bytes(wrong_digest, 20)","false","true",
               (char *)in_R9._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ecdsa/ecdsa_test.cc"
               ,0x94,(char *)local_f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_110,(Message *)local_b0);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_110);
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  return;
}

Assistant:

TEST(ECDSATest, BuiltinCurves) {
  // Fill digest values with some random data.
  uint8_t digest[20], wrong_digest[20];
  ASSERT_TRUE(RAND_bytes(digest, 20));
  CONSTTIME_DECLASSIFY(digest, 20);
  ASSERT_TRUE(RAND_bytes(wrong_digest, 20));
  CONSTTIME_DECLASSIFY(wrong_digest, 20);

  static const struct {
    int nid;
    const char *name;
  } kCurves[] = {
      { NID_secp224r1, "secp224r1" },
      { NID_X9_62_prime256v1, "secp256r1" },
      { NID_secp384r1, "secp384r1" },
      { NID_secp521r1, "secp521r1" },
      { NID_secp160r1, "secp160r1" },
  };

  for (const auto &curve : kCurves) {
    SCOPED_TRACE(curve.name);

    bssl::UniquePtr<EC_GROUP> group;
    if (curve.nid == NID_secp160r1) {
      group = NewSecp160r1Group();
    } else {
      group.reset(EC_GROUP_new_by_curve_name(curve.nid));
    }
    ASSERT_TRUE(group);
    const BIGNUM *order = EC_GROUP_get0_order(group.get());

    // Create a new ECDSA key.
    bssl::UniquePtr<EC_KEY> eckey(EC_KEY_new());
    ASSERT_TRUE(eckey);
    ASSERT_TRUE(EC_KEY_set_group(eckey.get(), group.get()));
    ASSERT_TRUE(EC_KEY_generate_key(eckey.get()));

    // Create a second key.
    bssl::UniquePtr<EC_KEY> wrong_eckey(EC_KEY_new());
    ASSERT_TRUE(wrong_eckey);
    ASSERT_TRUE(EC_KEY_set_group(wrong_eckey.get(), group.get()));
    ASSERT_TRUE(EC_KEY_generate_key(wrong_eckey.get()));

    // Check the key.
    EXPECT_TRUE(EC_KEY_check_key(eckey.get()));

    // Test ASN.1-encoded signatures.
    // Create a signature.
    std::vector<uint8_t> signature(ECDSA_size(eckey.get()));
    unsigned sig_len;
    ASSERT_TRUE(
        ECDSA_sign(0, digest, 20, signature.data(), &sig_len, eckey.get()));
    signature.resize(sig_len);

    // ECDSA signing should be non-deterministic. This does not verify k is
    // generated securely but at least checks it was randomized at all.
    std::vector<uint8_t> signature2(ECDSA_size(eckey.get()));
    ASSERT_TRUE(
        ECDSA_sign(0, digest, 20, signature2.data(), &sig_len, eckey.get()));
    signature2.resize(sig_len);
    EXPECT_NE(Bytes(signature), Bytes(signature2));

    // Verify the signature.
    EXPECT_TRUE(ECDSA_verify(0, digest, 20, signature.data(), signature.size(),
                             eckey.get()));

    // Verify the signature with the wrong key.
    EXPECT_FALSE(ECDSA_verify(0, digest, 20, signature.data(), signature.size(),
                              wrong_eckey.get()));
    ERR_clear_error();

    // Verify the signature using the wrong digest.
    EXPECT_FALSE(ECDSA_verify(0, wrong_digest, 20, signature.data(),
                              signature.size(), eckey.get()));
    ERR_clear_error();

    // Verify a truncated signature.
    EXPECT_FALSE(ECDSA_verify(0, digest, 20, signature.data(),
                              signature.size() - 1, eckey.get()));
    ERR_clear_error();

    // Verify a tampered signature.
    bssl::UniquePtr<ECDSA_SIG> ecdsa_sig(
        ECDSA_SIG_from_bytes(signature.data(), signature.size()));
    ASSERT_TRUE(ecdsa_sig);
    TestTamperedSig(kEncodedAPI, digest, 20, ecdsa_sig.get(), eckey.get(),
                    order);

    // Test ECDSA_SIG signing and verification.
    // Create a signature.
    ecdsa_sig.reset(ECDSA_do_sign(digest, 20, eckey.get()));
    ASSERT_TRUE(ecdsa_sig);

    // Verify the signature using the correct key.
    EXPECT_TRUE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));

    // Verify the signature with the wrong key.
    EXPECT_FALSE(
        ECDSA_do_verify(digest, 20, ecdsa_sig.get(), wrong_eckey.get()));
    ERR_clear_error();

    // Verify the signature using the wrong digest.
    EXPECT_FALSE(
        ECDSA_do_verify(wrong_digest, 20, ecdsa_sig.get(), eckey.get()));
    ERR_clear_error();

    // Verify a tampered signature.
    TestTamperedSig(kRawAPI, digest, 20, ecdsa_sig.get(), eckey.get(), order);

    // Negative components should not be accepted.
    BN_set_negative(ecdsa_sig->r, 1);
    EXPECT_FALSE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));
    BN_set_negative(ecdsa_sig->r, 0);
    BN_set_negative(ecdsa_sig->s, 1);
    EXPECT_FALSE(ECDSA_do_verify(digest, 20, ecdsa_sig.get(), eckey.get()));
    BN_set_negative(ecdsa_sig->s, 0);
  }
}